

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

int mz_inflate(mz_streamp pStream,int flush)

{
  mz_uint32 *pOut_buf_start;
  mz_uint32 mVar1;
  uint uVar2;
  mz_uint32 mVar3;
  tinfl_decompressor *r;
  tinfl_status tVar4;
  uint uVar5;
  mz_uint32 mVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  size_t out_bytes;
  size_t in_bytes;
  ulong local_40;
  mz_uint32 *local_38;
  
  uVar5 = 0xfffffffe;
  if ((pStream != (mz_streamp)0x0) &&
     (r = (tinfl_decompressor *)pStream->state, r != (tinfl_decompressor *)0x0)) {
    uVar7 = 2;
    if (flush != 1) {
      uVar7 = flush;
    }
    if ((uVar7 < 5) && ((0x15U >> (uVar7 & 0x1f) & 1) != 0)) {
      in_bytes = (size_t)pStream->avail_in;
      mVar1 = r[1].m_zhdr0;
      r[1].m_zhdr0 = 0;
      if (*(int *)(r[3].m_len_codes + 0xf8) < 0) {
        uVar5 = 0xfffffffd;
      }
      else if (uVar7 == 4 || r[1].m_zhdr1 == 0) {
        uVar5 = (uint)(0 < (int)r[1].m_z_adler32);
        r[1].m_zhdr1 = r[1].m_zhdr1 | (uint)(uVar7 == 4);
        if ((uVar7 == 4) && (mVar1 != 0)) {
          out_bytes = (size_t)pStream->avail_out;
          tVar4 = tinfl_decompress(r,pStream->next_in,&in_bytes,pStream->next_out,pStream->next_out,
                                   &out_bytes,uVar5 | 0xc);
          *(tinfl_status *)(r[3].m_len_codes + 0xf8) = tVar4;
          pStream->next_in = pStream->next_in + (in_bytes & 0xffffffff);
          pStream->avail_in = pStream->avail_in - (int)in_bytes;
          pStream->total_in = pStream->total_in + (in_bytes & 0xffffffff);
          pStream->adler = (ulong)r->m_check_adler32;
          pStream->next_out = pStream->next_out + (out_bytes & 0xffffffff);
          pStream->avail_out = pStream->avail_out - (int)out_bytes;
          pStream->total_out = pStream->total_out + (out_bytes & 0xffffffff);
          uVar5 = 0xfffffffd;
          if (TINFL_STATUS_FAILED < tVar4) {
            if (tVar4 == TINFL_STATUS_DONE) {
              uVar5 = 1;
            }
            else {
              r[3].m_len_codes[0xf8] = 0xff;
              r[3].m_len_codes[0xf9] = 0xff;
              r[3].m_len_codes[0xfa] = 0xff;
              r[3].m_len_codes[0xfb] = 0xff;
LAB_00129c93:
              uVar5 = 0xfffffffb;
            }
          }
        }
        else {
          mVar1 = uVar5 | 10;
          if (uVar7 == 4) {
            mVar1 = uVar5 | 8;
          }
          uVar5 = r[1].m_num_bits;
          if (uVar5 == 0) {
            pOut_buf_start = &r[1].m_final;
            mVar6 = r[1].m_state;
            local_40 = in_bytes;
            local_38 = pOut_buf_start;
            while( true ) {
              out_bytes = (size_t)(0x8000 - mVar6);
              tVar4 = tinfl_decompress(r,pStream->next_in,&in_bytes,(mz_uint8 *)pOut_buf_start,
                                       (mz_uint8 *)((ulong)mVar6 + (long)pOut_buf_start),&out_bytes,
                                       mVar1);
              *(tinfl_status *)(r[3].m_len_codes + 0xf8) = tVar4;
              pStream->next_in = pStream->next_in + (in_bytes & 0xffffffff);
              pStream->avail_in = pStream->avail_in - (int)in_bytes;
              pStream->total_in = pStream->total_in + (in_bytes & 0xffffffff);
              pStream->adler = (ulong)r->m_check_adler32;
              r[1].m_num_bits = (uint)out_bytes;
              uVar5 = (uint)out_bytes;
              if (pStream->avail_out < (uint)out_bytes) {
                uVar5 = pStream->avail_out;
              }
              uVar8 = (ulong)uVar5;
              __wrap_memcpy(pStream->next_out,(void *)((ulong)r[1].m_state + (long)pOut_buf_start),
                            uVar8);
              pStream->next_out = pStream->next_out + uVar8;
              uVar2 = pStream->avail_out;
              pStream->avail_out = uVar2 - uVar5;
              pStream->total_out = pStream->total_out + uVar8;
              mVar3 = r[1].m_num_bits;
              r[1].m_num_bits = mVar3 - uVar5;
              mVar6 = r[1].m_state + uVar5 & 0x7fff;
              r[1].m_state = mVar6;
              if (tVar4 < TINFL_STATUS_DONE) break;
              if (tVar4 == TINFL_STATUS_NEEDS_MORE_INPUT && (int)local_40 == 0) goto LAB_00129c93;
              if (uVar7 == 4) {
                if (tVar4 == TINFL_STATUS_DONE) {
                  if (mVar3 != uVar5) {
                    return -5;
                  }
                  return 1;
                }
                if (uVar2 == uVar5) goto LAB_00129c93;
                in_bytes = (size_t)pStream->avail_in;
              }
              else {
                if (tVar4 == TINFL_STATUS_DONE) {
                  bVar9 = mVar3 == uVar5;
                  goto LAB_00129d27;
                }
                in_bytes = (size_t)pStream->avail_in;
                if (pStream->avail_in == 0) {
                  return 0;
                }
                if (uVar2 == uVar5) {
                  return 0;
                }
                if (mVar3 != uVar5) {
                  return 0;
                }
              }
            }
            uVar5 = 0xfffffffd;
          }
          else {
            uVar7 = pStream->avail_out;
            if (uVar5 < pStream->avail_out) {
              uVar7 = uVar5;
            }
            uVar8 = (ulong)uVar7;
            __wrap_memcpy(pStream->next_out,
                          (void *)((long)r[1].m_table_sizes + ((ulong)r[1].m_state - 0x18)),uVar8);
            pStream->next_out = pStream->next_out + uVar8;
            pStream->avail_out = pStream->avail_out - uVar7;
            pStream->total_out = pStream->total_out + uVar8;
            mVar1 = r[1].m_num_bits;
            r[1].m_num_bits = mVar1 - uVar7;
            r[1].m_state = r[1].m_state + uVar7 & 0x7fff;
            uVar5 = 0;
            if (*(int *)(r[3].m_len_codes + 0xf8) == 0) {
              bVar9 = mVar1 == uVar7;
LAB_00129d27:
              uVar5 = (uint)bVar9;
            }
          }
        }
      }
    }
  }
  return uVar5;
}

Assistant:

int mz_inflate(mz_streamp pStream, int flush)
{
  inflate_state* pState;
  mz_uint n, first_call, decomp_flags = TINFL_FLAG_COMPUTE_ADLER32;
  size_t in_bytes, out_bytes, orig_avail_in;
  tinfl_status status;

  if ((!pStream) || (!pStream->state)) return MZ_STREAM_ERROR;
  if (flush == MZ_PARTIAL_FLUSH) flush = MZ_SYNC_FLUSH;
  if ((flush) && (flush != MZ_SYNC_FLUSH) && (flush != MZ_FINISH)) return MZ_STREAM_ERROR;

  pState = (inflate_state*)pStream->state;
  if (pState->m_window_bits > 0) decomp_flags |= TINFL_FLAG_PARSE_ZLIB_HEADER;
  orig_avail_in = pStream->avail_in;

  first_call = pState->m_first_call; pState->m_first_call = 0;
  if (pState->m_last_status < 0) return MZ_DATA_ERROR;

  if (pState->m_has_flushed && (flush != MZ_FINISH)) return MZ_STREAM_ERROR;
  pState->m_has_flushed |= (flush == MZ_FINISH);

  if ((flush == MZ_FINISH) && (first_call))
  {
    // MZ_FINISH on the first call implies that the input and output buffers are large enough to hold the entire compressed/decompressed file.
    decomp_flags |= TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF;
    in_bytes = pStream->avail_in; out_bytes = pStream->avail_out;
    status = tinfl_decompress(&pState->m_decomp, pStream->next_in, &in_bytes, pStream->next_out, pStream->next_out, &out_bytes, decomp_flags);
    pState->m_last_status = status;
    pStream->next_in += (mz_uint)in_bytes; pStream->avail_in -= (mz_uint)in_bytes; pStream->total_in += (mz_uint)in_bytes;
    pStream->adler = tinfl_get_adler32(&pState->m_decomp);
    pStream->next_out += (mz_uint)out_bytes; pStream->avail_out -= (mz_uint)out_bytes; pStream->total_out += (mz_uint)out_bytes;

    if (status < 0)
      return MZ_DATA_ERROR;
    else if (status != TINFL_STATUS_DONE)
    {
      pState->m_last_status = TINFL_STATUS_FAILED;
      return MZ_BUF_ERROR;
    }
    return MZ_STREAM_END;
  }
  // flush != MZ_FINISH then we must assume there's more input.
  if (flush != MZ_FINISH) decomp_flags |= TINFL_FLAG_HAS_MORE_INPUT;

  if (pState->m_dict_avail)
  {
    n = MZ_MIN(pState->m_dict_avail, pStream->avail_out);
    memcpy(pStream->next_out, pState->m_dict + pState->m_dict_ofs, n);
    pStream->next_out += n; pStream->avail_out -= n; pStream->total_out += n;
    pState->m_dict_avail -= n; pState->m_dict_ofs = (pState->m_dict_ofs + n) & (TINFL_LZ_DICT_SIZE - 1);
    return ((pState->m_last_status == TINFL_STATUS_DONE) && (!pState->m_dict_avail)) ? MZ_STREAM_END : MZ_OK;
  }

  for ( ; ; )
  {
    in_bytes = pStream->avail_in;
    out_bytes = TINFL_LZ_DICT_SIZE - pState->m_dict_ofs;

    status = tinfl_decompress(&pState->m_decomp, pStream->next_in, &in_bytes, pState->m_dict, pState->m_dict + pState->m_dict_ofs, &out_bytes, decomp_flags);
    pState->m_last_status = status;

    pStream->next_in += (mz_uint)in_bytes; pStream->avail_in -= (mz_uint)in_bytes;
    pStream->total_in += (mz_uint)in_bytes; pStream->adler = tinfl_get_adler32(&pState->m_decomp);

    pState->m_dict_avail = (mz_uint)out_bytes;

    n = MZ_MIN(pState->m_dict_avail, pStream->avail_out);
    memcpy(pStream->next_out, pState->m_dict + pState->m_dict_ofs, n);
    pStream->next_out += n; pStream->avail_out -= n; pStream->total_out += n;
    pState->m_dict_avail -= n; pState->m_dict_ofs = (pState->m_dict_ofs + n) & (TINFL_LZ_DICT_SIZE - 1);

    if (status < 0)
       return MZ_DATA_ERROR; // Stream is corrupted (there could be some uncompressed data left in the output dictionary - oh well).
    else if ((status == TINFL_STATUS_NEEDS_MORE_INPUT) && (!orig_avail_in))
      return MZ_BUF_ERROR; // Signal caller that we can't make forward progress without supplying more input or by setting flush to MZ_FINISH.
    else if (flush == MZ_FINISH)
    {
       // The output buffer MUST be large to hold the remaining uncompressed data when flush==MZ_FINISH.
       if (status == TINFL_STATUS_DONE)
          return pState->m_dict_avail ? MZ_BUF_ERROR : MZ_STREAM_END;
       // status here must be TINFL_STATUS_HAS_MORE_OUTPUT, which means there's at least 1 more byte on the way. If there's no more room left in the output buffer then something is wrong.
       else if (!pStream->avail_out)
          return MZ_BUF_ERROR;
    }
    else if ((status == TINFL_STATUS_DONE) || (!pStream->avail_in) || (!pStream->avail_out) || (pState->m_dict_avail))
      break;
  }

  return ((status == TINFL_STATUS_DONE) && (!pState->m_dict_avail)) ? MZ_STREAM_END : MZ_OK;
}